

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++:181:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_orphan_test_c__:181:3)>
      *this)

{
  Builder *pBVar1;
  Builder *pBVar2;
  OrphanBuilder local_68;
  OrphanBuilder local_48;
  PointerBuilder local_28;
  
  pBVar1 = (this->func).root2;
  pBVar2 = (this->func).root1;
  local_28.pointer = (pBVar2->_builder).pointers + 2;
  local_28.segment = (pBVar2->_builder).segment;
  local_28.capTable = (pBVar2->_builder).capTable;
  capnp::_::PointerBuilder::disown(&local_48,&local_28);
  local_68.segment = local_48.segment;
  local_68.capTable = local_48.capTable;
  local_68.location = local_48.location;
  local_68.tag.content = local_48.tag.content;
  local_48.capTable = (CapTableBuilder *)((pBVar1->_builder).pointers + 2);
  local_48.tag.content = (uint64_t)(pBVar1->_builder).segment;
  local_48.segment = (SegmentBuilder *)(pBVar1->_builder).capTable;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)&local_48,&local_68);
  if (local_68.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_68);
  }
  return;
}

Assistant:

void run() override {
    func();
  }